

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O3

void __thiscall QTextCursorPrivate::setX(QTextCursorPrivate *this)

{
  QTextDocumentPrivate *pQVar1;
  uint uVar2;
  int iVar3;
  QTextLayout *this_00;
  int iVar4;
  long in_FS_OFFSET;
  qreal qVar5;
  QTextLine QVar6;
  undefined1 *local_58;
  QTextEngine *local_50;
  int local_44;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->priv;
  if ((pQVar1->editBlock == 0) && (pQVar1->inContentsChange != true)) {
    local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uVar2 = QFragmentMapData<QTextBlockData>::findNode(&(pQVar1->blocks).data,this->position,0);
    local_40._8_4_ = uVar2;
    local_40._0_8_ = pQVar1;
    this_00 = blockLayout(this,(QTextBlock *)local_40);
    iVar4 = this->position;
    iVar3 = QTextBlock::position((QTextBlock *)local_40);
    iVar4 = iVar4 - iVar3;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    QVar6 = QTextLayout::lineForTextPosition(this_00,iVar4);
    local_50 = QVar6.eng;
    local_58 = (undefined1 *)CONCAT44(local_58._4_4_,QVar6.index);
    if (local_50 == (QTextEngine *)0x0) {
      qVar5 = -1.0;
    }
    else {
      local_44 = iVar4;
      qVar5 = QTextLine::cursorToX((QTextLine *)&local_58,&local_44,Leading);
    }
    this->x = qVar5;
  }
  else {
    this->x = -1.0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursorPrivate::setX()
{
    if (priv->isInEditBlock() || priv->inContentsChange) {
        x = -1; // mark dirty
        return;
    }

    QTextBlock block = this->block();
    const QTextLayout *layout = blockLayout(block);
    int pos = position - block.position();

    QTextLine line = layout->lineForTextPosition(pos);
    if (line.isValid())
        x = line.cursorToX(pos);
    else
        x = -1; // delayed init.  Makes movePosition() call setX later on again.
}